

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTests.cpp
# Opt level: O2

int __thiscall gl4cts::DirectStateAccess::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  DefaultsTest *this_00;
  BuffersTest *this_01;
  ErrorsTest *this_02;
  FunctionalTest *this_03;
  DefaultsTest *this_04;
  FunctionalTest *this_05;
  DefaultsTest *this_06;
  FunctionalTest *this_07;
  DefaultsTest *this_08;
  ErrorsTest *this_09;
  FunctionalTest *this_10;
  DataTest *this_11;
  ClearTest *this_12;
  MapReadOnlyTest *this_13;
  MapReadWriteTest *this_14;
  MapWriteOnlyTest *this_15;
  MapRangeReadBitTest *this_16;
  MapRangeWriteBitTest *this_17;
  SubDataQueryTest *this_18;
  DefaultsTest *this_19;
  ErrorsTest *this_20;
  FunctionalTest *this_21;
  RenderbufferAttachmentTest *this_22;
  TextureAttachmentTest *this_23;
  TextureLayerAttachmentTest *this_24;
  ClearTest *this_25;
  BlitTest *this_26;
  GetParametersTest *this_27;
  GetAttachmentParametersTest *this_28;
  RenderbufferAttachmentErrorsTest *this_29;
  TextureAttachmentErrorsTest *this_30;
  DrawReadBuffersErrorsTest *this_31;
  InvalidateDataAndSubDataErrorsTest *this_32;
  ClearNamedFramebufferErrorsTest *this_33;
  CheckStatusErrorsTest *this_34;
  GetParameterErrorsTest *this_35;
  GetAttachmentParameterErrorsTest *this_36;
  FunctionalTest *this_37;
  StorageTest *this_38;
  StorageMultisampleTest *this_39;
  GetParametersTest *this_40;
  StorageErrorsTest *this_41;
  StorageMultisampleErrorsTest *this_42;
  GetParameterErrorsTest *this_43;
  EnableDisableAttributesTest *this_44;
  ElementBufferTest *this_45;
  VertexBuffersTest *this_46;
  AttributeFormatTest *this_47;
  AttributeBindingTest *this_48;
  AttributeBindingDivisorTest *this_49;
  GetVertexArrayIndexedTest *this_50;
  DefaultsTest *this_51;
  BufferTest *this_52;
  StorageAndSubImageTest *this_53;
  StorageMultisampleTest *this_54;
  CompressedSubImageTest *this_55;
  CopyTest *this_56;
  BindUnitTest *this_57;
  StorageErrorsTest *this_58;
  SubImageErrorsTest *this_59;
  CopyErrorsTest *this_60;
  ParameterSetupErrorsTest *this_61;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  TransformFeedback::CreationTest::CreationTest
            ((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (DefaultsTest *)operator_new(0x98);
  TransformFeedback::DefaultsTest::DefaultsTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (BuffersTest *)operator_new(0xa8);
  TransformFeedback::BuffersTest::BuffersTest(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (ErrorsTest *)operator_new(0x90);
  TransformFeedback::ErrorsTest::ErrorsTest(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (FunctionalTest *)operator_new(0x98);
  TransformFeedback::FunctionalTest::FunctionalTest(this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pTVar1 = (TestNode *)operator_new(0x78);
  Samplers::CreationTest::CreationTest((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_04 = (DefaultsTest *)operator_new(0x80);
  Samplers::DefaultsTest::DefaultsTest(this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x78);
  Samplers::ErrorsTest::ErrorsTest((ErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_05 = (FunctionalTest *)operator_new(0x90);
  Samplers::FunctionalTest::FunctionalTest(this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  pTVar1 = (TestNode *)operator_new(0x78);
  ProgramPipelines::CreationTest::CreationTest
            ((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_06 = (DefaultsTest *)operator_new(0x80);
  ProgramPipelines::DefaultsTest::DefaultsTest(this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  pTVar1 = (TestNode *)operator_new(0x78);
  ProgramPipelines::ErrorsTest::ErrorsTest
            ((ErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_07 = (FunctionalTest *)operator_new(0x90);
  ProgramPipelines::FunctionalTest::FunctionalTest(this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  pTVar1 = (TestNode *)operator_new(0x78);
  Queries::CreationTest::CreationTest((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_08 = (DefaultsTest *)operator_new(0x80);
  Queries::DefaultsTest::DefaultsTest(this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
  this_09 = (ErrorsTest *)operator_new(0x98);
  Queries::ErrorsTest::ErrorsTest(this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
  this_10 = (FunctionalTest *)operator_new(0xc0);
  Queries::FunctionalTest::FunctionalTest(this_10,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
  pTVar1 = (TestNode *)operator_new(0x78);
  Buffers::CreationTest::CreationTest((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_11 = (DataTest *)operator_new(0x98);
  Buffers::DataTest::DataTest(this_11,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
  this_12 = (ClearTest *)operator_new(0x90);
  Buffers::ClearTest::ClearTest(this_12,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
  this_13 = (MapReadOnlyTest *)operator_new(0x90);
  Buffers::MapReadOnlyTest::MapReadOnlyTest(this_13,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
  this_14 = (MapReadWriteTest *)operator_new(0x90);
  Buffers::MapReadWriteTest::MapReadWriteTest(this_14,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
  this_15 = (MapWriteOnlyTest *)operator_new(0x90);
  Buffers::MapWriteOnlyTest::MapWriteOnlyTest(this_15,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
  this_16 = (MapRangeReadBitTest *)operator_new(0x90);
  Buffers::MapRangeReadBitTest::MapRangeReadBitTest(this_16,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
  this_17 = (MapRangeWriteBitTest *)operator_new(0x98);
  Buffers::MapRangeWriteBitTest::MapRangeWriteBitTest(this_17,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
  this_18 = (SubDataQueryTest *)operator_new(0x88);
  Buffers::SubDataQueryTest::SubDataQueryTest(this_18,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
  this_19 = (DefaultsTest *)operator_new(0x98);
  Buffers::DefaultsTest::DefaultsTest(this_19,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
  this_20 = (ErrorsTest *)operator_new(0xe8);
  Buffers::ErrorsTest::ErrorsTest(this_20,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_20);
  this_21 = (FunctionalTest *)operator_new(0x100);
  Buffers::FunctionalTest::FunctionalTest(this_21,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_21);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::CreationTest::CreationTest
            ((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_22 = (RenderbufferAttachmentTest *)operator_new(0x80);
  Framebuffers::RenderbufferAttachmentTest::RenderbufferAttachmentTest
            (this_22,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_22);
  this_23 = (TextureAttachmentTest *)operator_new(0x80);
  Framebuffers::TextureAttachmentTest::TextureAttachmentTest
            (this_23,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_23);
  this_24 = (TextureLayerAttachmentTest *)operator_new(0x80);
  Framebuffers::TextureLayerAttachmentTest::TextureLayerAttachmentTest
            (this_24,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_24);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::DrawReadBufferTest::DrawReadBufferTest
            ((DrawReadBufferTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::DrawBuffersTest::DrawBuffersTest
            ((DrawBuffersTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::InvalidateDataTest::InvalidateDataTest
            ((InvalidateDataTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::InvalidateSubDataTest::InvalidateSubDataTest
            ((InvalidateSubDataTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_25 = (ClearTest *)operator_new(0x90);
  Framebuffers::ClearTest::ClearTest(this_25,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_25);
  this_26 = (BlitTest *)operator_new(0x90);
  Framebuffers::BlitTest::BlitTest(this_26,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_26);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::CheckStatusTest::CheckStatusTest
            ((CheckStatusTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_27 = (GetParametersTest *)operator_new(0x80);
  Framebuffers::GetParametersTest::GetParametersTest(this_27,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_27);
  this_28 = (GetAttachmentParametersTest *)operator_new(0x90);
  Framebuffers::GetAttachmentParametersTest::GetAttachmentParametersTest
            (this_28,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_28);
  pTVar1 = (TestNode *)operator_new(0x78);
  Framebuffers::CreationErrorsTest::CreationErrorsTest
            ((CreationErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_29 = (RenderbufferAttachmentErrorsTest *)operator_new(0x98);
  Framebuffers::RenderbufferAttachmentErrorsTest::RenderbufferAttachmentErrorsTest
            (this_29,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_29);
  this_30 = (TextureAttachmentErrorsTest *)operator_new(0xb8);
  Framebuffers::TextureAttachmentErrorsTest::TextureAttachmentErrorsTest
            (this_30,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_30);
  this_31 = (DrawReadBuffersErrorsTest *)operator_new(200);
  Framebuffers::DrawReadBuffersErrorsTest::DrawReadBuffersErrorsTest
            (this_31,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_31);
  this_32 = (InvalidateDataAndSubDataErrorsTest *)operator_new(0x98);
  Framebuffers::InvalidateDataAndSubDataErrorsTest::InvalidateDataAndSubDataErrorsTest
            (this_32,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_32);
  this_33 = (ClearNamedFramebufferErrorsTest *)operator_new(0x88);
  Framebuffers::ClearNamedFramebufferErrorsTest::ClearNamedFramebufferErrorsTest
            (this_33,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_33);
  this_34 = (CheckStatusErrorsTest *)operator_new(0x88);
  Framebuffers::CheckStatusErrorsTest::CheckStatusErrorsTest
            (this_34,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_34);
  this_35 = (GetParameterErrorsTest *)operator_new(0x88);
  Framebuffers::GetParameterErrorsTest::GetParameterErrorsTest
            (this_35,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_35);
  this_36 = (GetAttachmentParameterErrorsTest *)operator_new(0x98);
  Framebuffers::GetAttachmentParameterErrorsTest::GetAttachmentParameterErrorsTest
            (this_36,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_36);
  this_37 = (FunctionalTest *)operator_new(0xa8);
  Framebuffers::FunctionalTest::FunctionalTest(this_37,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_37);
  pTVar1 = (TestNode *)operator_new(0x78);
  Renderbuffers::CreationTest::CreationTest
            ((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_38 = (StorageTest *)operator_new(0x80);
  Renderbuffers::StorageTest::StorageTest(this_38,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_38);
  this_39 = (StorageMultisampleTest *)operator_new(0x88);
  Renderbuffers::StorageMultisampleTest::StorageMultisampleTest
            (this_39,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_39);
  this_40 = (GetParametersTest *)operator_new(0x80);
  Renderbuffers::GetParametersTest::GetParametersTest(this_40,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_40);
  pTVar1 = (TestNode *)operator_new(0x78);
  Renderbuffers::CreationErrorsTest::CreationErrorsTest
            ((CreationErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_41 = (StorageErrorsTest *)operator_new(0x88);
  Renderbuffers::StorageErrorsTest::StorageErrorsTest(this_41,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_41);
  this_42 = (StorageMultisampleErrorsTest *)operator_new(0x90);
  Renderbuffers::StorageMultisampleErrorsTest::StorageMultisampleErrorsTest
            (this_42,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_42);
  this_43 = (GetParameterErrorsTest *)operator_new(0x88);
  Renderbuffers::GetParameterErrorsTest::GetParameterErrorsTest
            (this_43,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_43);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::CreationTest::CreationTest
            ((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_44 = (EnableDisableAttributesTest *)operator_new(0x90);
  VertexArrays::EnableDisableAttributesTest::EnableDisableAttributesTest
            (this_44,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_44);
  this_45 = (ElementBufferTest *)operator_new(0x90);
  VertexArrays::ElementBufferTest::ElementBufferTest(this_45,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_45);
  this_46 = (VertexBuffersTest *)operator_new(0x90);
  VertexArrays::VertexBuffersTest::VertexBuffersTest(this_46,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_46);
  this_47 = (AttributeFormatTest *)operator_new(0x88);
  VertexArrays::AttributeFormatTest::AttributeFormatTest
            (this_47,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_47);
  this_48 = (AttributeBindingTest *)operator_new(0x88);
  VertexArrays::AttributeBindingTest::AttributeBindingTest
            (this_48,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_48);
  this_49 = (AttributeBindingDivisorTest *)operator_new(0x88);
  VertexArrays::AttributeBindingDivisorTest::AttributeBindingDivisorTest
            (this_49,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_49);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::GetVertexArrayTest::GetVertexArrayTest
            ((GetVertexArrayTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_50 = (GetVertexArrayIndexedTest *)operator_new(0x90);
  VertexArrays::GetVertexArrayIndexedTest::GetVertexArrayIndexedTest
            (this_50,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_50);
  this_51 = (DefaultsTest *)operator_new(0x80);
  VertexArrays::DefaultsTest::DefaultsTest(this_51,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_51);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::CreationErrorTest::CreationErrorTest
            ((CreationErrorTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::EnableDisableAttributeErrorsTest::EnableDisableAttributeErrorsTest
            ((EnableDisableAttributeErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::ElementBufferErrorsTest::ElementBufferErrorsTest
            ((ElementBufferErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::VertexBuffersErrorsTest::VertexBuffersErrorsTest
            ((VertexBuffersErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::AttributeFormatErrorsTest::AttributeFormatErrorsTest
            ((AttributeFormatErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::AttributeBindingErrorsTest::AttributeBindingErrorsTest
            ((AttributeBindingErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::AttributeBindingDivisorErrorsTest::AttributeBindingDivisorErrorsTest
            ((AttributeBindingDivisorErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::GetVertexArrayErrorsTest::GetVertexArrayErrorsTest
            ((GetVertexArrayErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrays::GetVertexArrayIndexedErrorsTest::GetVertexArrayIndexedErrorsTest
            ((GetVertexArrayIndexedErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::CreationTest::CreationTest((CreationTest *)pTVar1,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_52 = (BufferTest *)operator_new(0x90);
  Textures::BufferTest::BufferTest(this_52,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_52);
  this_53 = (StorageAndSubImageTest *)operator_new(0x90);
  Textures::StorageAndSubImageTest::StorageAndSubImageTest
            (this_53,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_53);
  this_54 = (StorageMultisampleTest *)operator_new(0x98);
  Textures::StorageMultisampleTest::StorageMultisampleTest
            (this_54,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_54);
  this_55 = (CompressedSubImageTest *)operator_new(0x98);
  Textures::CompressedSubImageTest::CompressedSubImageTest
            (this_55,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_55);
  this_56 = (CopyTest *)operator_new(0x90);
  Textures::CopyTest::CopyTest(this_56,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_56);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::GetSetParameterTest::GetSetParameterTest
            ((GetSetParameterTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::DefaultsTest::DefaultsTest((DefaultsTest *)pTVar1,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::GenerateMipmapTest::GenerateMipmapTest
            ((GenerateMipmapTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_57 = (BindUnitTest *)operator_new(0xa0);
  Textures::BindUnitTest::BindUnitTest(this_57,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_57);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::GetImageTest::GetImageTest((GetImageTest *)pTVar1,(this->super_TestCaseGroup).m_context)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::GetLevelParameterTest::GetLevelParameterTest
            ((GetLevelParameterTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::CreationErrorsTest::CreationErrorsTest
            ((CreationErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::BufferErrorsTest::BufferErrorsTest
            ((BufferErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::BufferRangeErrorsTest::BufferRangeErrorsTest
            ((BufferRangeErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_58 = (StorageErrorsTest *)operator_new(0xb0);
  Textures::StorageErrorsTest::StorageErrorsTest(this_58,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_58);
  this_59 = (SubImageErrorsTest *)operator_new(0x100);
  Textures::SubImageErrorsTest::SubImageErrorsTest(this_59,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_59);
  this_60 = (CopyErrorsTest *)operator_new(0xa0);
  Textures::CopyErrorsTest::CopyErrorsTest(this_60,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_60);
  this_61 = (ParameterSetupErrorsTest *)operator_new(0x90);
  Textures::ParameterSetupErrorsTest::ParameterSetupErrorsTest
            (this_61,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_61);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::GenerateMipmapErrorsTest::GenerateMipmapErrorsTest
            ((GenerateMipmapErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::BindUnitErrorsTest::BindUnitErrorsTest
            ((BindUnitErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::ImageQueryErrorsTest::ImageQueryErrorsTest
            ((ImageQueryErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::LevelParameterErrorsTest::LevelParameterErrorsTest
            ((LevelParameterErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Textures::ParameterErrorsTest::ParameterErrorsTest
            ((ParameterErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void Tests::init()
{
	/* Direct State Access of Transform Feedback Objects */
	addChild(new TransformFeedback::CreationTest(m_context));
	addChild(new TransformFeedback::DefaultsTest(m_context));
	addChild(new TransformFeedback::BuffersTest(m_context));
	addChild(new TransformFeedback::ErrorsTest(m_context));
	addChild(new TransformFeedback::FunctionalTest(m_context));

	/* Direct State Access of Sampler Objects */
	addChild(new Samplers::CreationTest(m_context));
	addChild(new Samplers::DefaultsTest(m_context));
	addChild(new Samplers::ErrorsTest(m_context));
	addChild(new Samplers::FunctionalTest(m_context));

	/* Direct State Access of Program Pipeline Objects */
	addChild(new ProgramPipelines::CreationTest(m_context));
	addChild(new ProgramPipelines::DefaultsTest(m_context));
	addChild(new ProgramPipelines::ErrorsTest(m_context));
	addChild(new ProgramPipelines::FunctionalTest(m_context));

	/* Direct State Access of Query Objects */
	addChild(new Queries::CreationTest(m_context));
	addChild(new Queries::DefaultsTest(m_context));
	addChild(new Queries::ErrorsTest(m_context));
	addChild(new Queries::FunctionalTest(m_context));

	/* Direct State Access of Buffer Objects */
	addChild(new Buffers::CreationTest(m_context));
	addChild(new Buffers::DataTest(m_context));
	addChild(new Buffers::ClearTest(m_context));
	addChild(new Buffers::MapReadOnlyTest(m_context));
	addChild(new Buffers::MapReadWriteTest(m_context));
	addChild(new Buffers::MapWriteOnlyTest(m_context));
	addChild(new Buffers::MapRangeReadBitTest(m_context));
	addChild(new Buffers::MapRangeWriteBitTest(m_context));
	addChild(new Buffers::SubDataQueryTest(m_context));
	addChild(new Buffers::DefaultsTest(m_context));
	addChild(new Buffers::ErrorsTest(m_context));
	addChild(new Buffers::FunctionalTest(m_context));

	/* Direct State Access of Framebuffer Objects */
	addChild(new Framebuffers::CreationTest(m_context));
	addChild(new Framebuffers::RenderbufferAttachmentTest(m_context));
	addChild(new Framebuffers::TextureAttachmentTest(m_context));
	addChild(new Framebuffers::TextureLayerAttachmentTest(m_context));
	addChild(new Framebuffers::DrawReadBufferTest(m_context));
	addChild(new Framebuffers::DrawBuffersTest(m_context));
	addChild(new Framebuffers::InvalidateDataTest(m_context));
	addChild(new Framebuffers::InvalidateSubDataTest(m_context));
	addChild(new Framebuffers::ClearTest(m_context));
	addChild(new Framebuffers::BlitTest(m_context));
	addChild(new Framebuffers::CheckStatusTest(m_context));
	addChild(new Framebuffers::GetParametersTest(m_context));
	addChild(new Framebuffers::GetAttachmentParametersTest(m_context));
	addChild(new Framebuffers::CreationErrorsTest(m_context));
	addChild(new Framebuffers::RenderbufferAttachmentErrorsTest(m_context));
	addChild(new Framebuffers::TextureAttachmentErrorsTest(m_context));
	addChild(new Framebuffers::DrawReadBuffersErrorsTest(m_context));
	addChild(new Framebuffers::InvalidateDataAndSubDataErrorsTest(m_context));
	addChild(new Framebuffers::ClearNamedFramebufferErrorsTest(m_context));
	addChild(new Framebuffers::CheckStatusErrorsTest(m_context));
	addChild(new Framebuffers::GetParameterErrorsTest(m_context));
	addChild(new Framebuffers::GetAttachmentParameterErrorsTest(m_context));
	addChild(new Framebuffers::FunctionalTest(m_context));

	/* Direct State Access of Renderbuffer Objects */
	addChild(new Renderbuffers::CreationTest(m_context));
	addChild(new Renderbuffers::StorageTest(m_context));
	addChild(new Renderbuffers::StorageMultisampleTest(m_context));
	addChild(new Renderbuffers::GetParametersTest(m_context));
	addChild(new Renderbuffers::CreationErrorsTest(m_context));
	addChild(new Renderbuffers::StorageErrorsTest(m_context));
	addChild(new Renderbuffers::StorageMultisampleErrorsTest(m_context));
	addChild(new Renderbuffers::GetParameterErrorsTest(m_context));

	/* Direct State Access of Vertex Array Objects */
	addChild(new VertexArrays::CreationTest(m_context));
	addChild(new VertexArrays::EnableDisableAttributesTest(m_context));
	addChild(new VertexArrays::ElementBufferTest(m_context));
	addChild(new VertexArrays::VertexBuffersTest(m_context));
	addChild(new VertexArrays::AttributeFormatTest(m_context));
	addChild(new VertexArrays::AttributeBindingTest(m_context));
	addChild(new VertexArrays::AttributeBindingDivisorTest(m_context));
	addChild(new VertexArrays::GetVertexArrayTest(m_context));
	addChild(new VertexArrays::GetVertexArrayIndexedTest(m_context));
	addChild(new VertexArrays::DefaultsTest(m_context));
	addChild(new VertexArrays::CreationErrorTest(m_context));
	addChild(new VertexArrays::EnableDisableAttributeErrorsTest(m_context));
	addChild(new VertexArrays::ElementBufferErrorsTest(m_context));
	addChild(new VertexArrays::VertexBuffersErrorsTest(m_context));
	addChild(new VertexArrays::AttributeFormatErrorsTest(m_context));
	addChild(new VertexArrays::AttributeBindingErrorsTest(m_context));
	addChild(new VertexArrays::AttributeBindingDivisorErrorsTest(m_context));
	addChild(new VertexArrays::GetVertexArrayErrorsTest(m_context));
	addChild(new VertexArrays::GetVertexArrayIndexedErrorsTest(m_context));

	/* Direct State Access of Tetxure Objects */
	addChild(new Textures::CreationTest(m_context));
	addChild(new Textures::BufferTest(m_context));
	addChild(new Textures::StorageAndSubImageTest(m_context));
	addChild(new Textures::StorageMultisampleTest(m_context));
	addChild(new Textures::CompressedSubImageTest(m_context));
	addChild(new Textures::CopyTest(m_context));
	addChild(new Textures::GetSetParameterTest(m_context));
	addChild(new Textures::DefaultsTest(m_context));
	addChild(new Textures::GenerateMipmapTest(m_context));
	addChild(new Textures::BindUnitTest(m_context));
	addChild(new Textures::GetImageTest(m_context));
	addChild(new Textures::GetLevelParameterTest(m_context));
	addChild(new Textures::CreationErrorsTest(m_context));
	addChild(new Textures::BufferErrorsTest(m_context));
	addChild(new Textures::BufferRangeErrorsTest(m_context));
	addChild(new Textures::StorageErrorsTest(m_context));
	addChild(new Textures::SubImageErrorsTest(m_context));
	addChild(new Textures::CopyErrorsTest(m_context));
	addChild(new Textures::ParameterSetupErrorsTest(m_context));
	addChild(new Textures::GenerateMipmapErrorsTest(m_context));
	addChild(new Textures::BindUnitErrorsTest(m_context));
	addChild(new Textures::ImageQueryErrorsTest(m_context));
	addChild(new Textures::LevelParameterErrorsTest(m_context));
	addChild(new Textures::ParameterErrorsTest(m_context));
}